

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O3

void __thiscall TcpServer::TcpServer(TcpServer *this)

{
  BaseSocketImpl *pBVar1;
  TcpServerImpl *this_00;
  
  (this->super_BaseSocket).Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)0x0;
  (this->super_BaseSocket)._vptr_BaseSocket = (_func_int **)&PTR__BaseSocket_001459b8;
  this_00 = (TcpServerImpl *)operator_new(0x1d0);
  TcpServerImpl::TcpServerImpl(this_00,&this->super_BaseSocket);
  pBVar1 = (this->super_BaseSocket).Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  (this->super_BaseSocket).Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)this_00;
  if (pBVar1 != (BaseSocketImpl *)0x0) {
    (*pBVar1->_vptr_BaseSocketImpl[1])();
    return;
  }
  return;
}

Assistant:

TcpServer::TcpServer()
{
    Impl_ = make_unique<TcpServerImpl>(this);
}